

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::DataDeclarationSyntax::DataDeclarationSyntax
          (DataDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *modifiers,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  bool bVar1;
  DataTypeSyntax *pDVar2;
  DeclaratorSyntax *pDVar3;
  DataTypeSyntax *in_RCX;
  SyntaxNode *in_RDI;
  DeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_ffffffffffffff88;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_58;
  undefined1 in_stack_ffffffffffffffb8 [16];
  DataTypeSyntax *local_30 [2];
  DataTypeSyntax *local_20;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)&stack0x00000008;
  local_20 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._4_4_,local_58);
  TokenList::TokenList((TokenList *)this_00,(TokenList *)in_stack_ffffffffffffff88);
  local_30[0] = local_20;
  not_null<slang::syntax::DataTypeSyntax_*>::not_null<slang::syntax::DataTypeSyntax_*>
            ((not_null<slang::syntax::DataTypeSyntax_*> *)&in_RDI[5].previewNode,local_30);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff88);
  in_RDI[8].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[8].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  *(SyntaxNode **)(in_RDI + 4) = in_RDI;
  pDVar2 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                     ((not_null<slang::syntax::DataTypeSyntax_*> *)0x2523fb);
  (pDVar2->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
  in_RDI[6].previewNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x252423);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::DeclaratorSyntax_*> *)in_stack_ffffffffffffff88
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x252462);
    (pDVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

DataDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& modifiers, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::DataDeclaration, attributes), modifiers(modifiers), type(&type), declarators(declarators), semi(semi) {
        this->modifiers.parent = this;
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }